

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picosha2.h
# Opt level: O2

void __thiscall
picosha2::hash256_one_by_one::process<unsigned_char_const*>
          (hash256_one_by_one *this,uchar *first,uchar *last)

{
  const_iterator __first;
  ulong uVar1;
  
  add_to_data_length(this,(long)last - (long)first);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (first,last,
             (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)this
            );
  uVar1 = 0x40;
  while( true ) {
    __first._M_current =
         (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->buffer_).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)__first._M_current) < uVar1) break;
    detail::
    hash256_block<unsigned_long*,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (this->h_,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         )(__first._M_current + (uVar1 - 0x40)),
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(__first._M_current + uVar1));
    uVar1 = uVar1 + 0x40;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
            (&this->buffer_,__first,(const_iterator)(__first._M_current + (uVar1 - 0x40)));
  return;
}

Assistant:

void process(RaIter first, RaIter last) {
        add_to_data_length(static_cast<word_t>(std::distance(first, last)));
        std::copy(first, last, std::back_inserter(buffer_));
        std::size_t i = 0;
        for (; i + 64 <= buffer_.size(); i += 64) {
            detail::hash256_block(h_, buffer_.begin() + i,
                                  buffer_.begin() + i + 64);
        }
        buffer_.erase(buffer_.begin(), buffer_.begin() + i);
    }